

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FoundationPileTests.cpp
# Opt level: O0

void __thiscall
solitaire::piles::EmptyFoundationPileTest_tryAddAce_Test::TestBody
          (EmptyFoundationPileTest_tryAddAce_Test *this)

{
  initializer_list<solitaire::cards::Card> __l;
  bool bVar1;
  const_reference __t;
  element_type *peVar2;
  char *pcVar3;
  undefined4 extraout_var;
  vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> *rhs;
  PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_>_>
  *matcher;
  AssertHelper local_100;
  Message local_f8;
  Value local_ec;
  _Optional_payload_base<solitaire::cards::Value> local_e8;
  undefined1 local_e0 [8];
  AssertionResult gtest_ar_2;
  Message local_c8;
  PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_>_>
  local_c0;
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_>_>_>
  local_a8;
  undefined1 local_90 [8];
  AssertionResult gtest_ar_1;
  Message local_78;
  undefined1 local_70 [8];
  AssertionResult gtest_ar;
  optional<solitaire::cards::Card> cardToAdd;
  allocator<solitaire::cards::Card> local_41;
  Card local_40;
  Card *local_38;
  size_type local_30;
  undefined1 local_28 [8];
  Cards pileCards;
  EmptyFoundationPileTest_tryAddAce_Test *this_local;
  
  pileCards.super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  solitaire::cards::Card::Card(&local_40,Ace,Heart);
  local_30 = 1;
  local_38 = &local_40;
  std::allocator<solitaire::cards::Card>::allocator(&local_41);
  __l._M_len = local_30;
  __l._M_array = local_38;
  std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>::vector
            ((vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> *)local_28,__l
             ,&local_41);
  std::allocator<solitaire::cards::Card>::~allocator(&local_41);
  __t = std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>::front
                  ((vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> *)
                   local_28);
  std::optional<solitaire::cards::Card>::optional<const_solitaire::cards::Card_&,_true>
            ((optional<solitaire::cards::Card> *)&gtest_ar.message_,__t);
  peVar2 = std::
           __shared_ptr_access<solitaire::piles::FoundationPile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<solitaire::piles::FoundationPile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&(this->super_EmptyFoundationPileTest).pile);
  (*(peVar2->super_FoundationPile).super_Archiver._vptr_Archiver[4])(peVar2,&gtest_ar.message_);
  testing::internal::EqHelper::
  Compare<std::optional<solitaire::cards::Card>,_std::nullopt_t,_nullptr>
            ((EqHelper *)local_70,"cardToAdd","std::nullopt",
             (optional<solitaire::cards::Card> *)&gtest_ar.message_,(nullopt_t *)&std::nullopt);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_70);
  if (!bVar1) {
    testing::Message::Message(&local_78);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_70);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/piles/FoundationPileTests.cpp"
               ,0x3b,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_78);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_70);
  testing::ContainerEq<std::vector<solitaire::cards::Card,std::allocator<solitaire::cards::Card>>>
            (&local_c0,(testing *)local_28,rhs);
  testing::internal::
  MakePredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<solitaire::cards::Card,std::allocator<solitaire::cards::Card>>>>>
            (&local_a8,(internal *)&local_c0,matcher);
  peVar2 = std::
           __shared_ptr_access<solitaire::piles::FoundationPile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<solitaire::piles::FoundationPile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&(this->super_EmptyFoundationPileTest).pile);
  (*(peVar2->super_FoundationPile).super_Archiver._vptr_Archiver[6])();
  testing::internal::
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<solitaire::cards::Card,std::allocator<solitaire::cards::Card>>>>>
  ::operator()(local_90,(char *)&local_a8,
               (vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> *)
               "pile->getCards()");
  testing::internal::
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_>_>_>
  ::~PredicateFormatterFromMatcher(&local_a8);
  testing::
  PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_>_>
  ::~PolymorphicMatcher(&local_c0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_90);
  if (!bVar1) {
    testing::Message::Message(&local_c8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_90);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/piles/FoundationPileTests.cpp"
               ,0x3c,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_90);
  peVar2 = std::
           __shared_ptr_access<solitaire::piles::FoundationPile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<solitaire::piles::FoundationPile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&(this->super_EmptyFoundationPileTest).pile);
  local_e8._M_payload._M_value =
       (*(peVar2->super_FoundationPile).super_Archiver._vptr_Archiver[7])();
  local_e8._4_4_ = extraout_var;
  local_ec = Ace;
  testing::internal::EqHelper::
  Compare<std::optional<solitaire::cards::Value>,_solitaire::cards::Value,_nullptr>
            ((EqHelper *)local_e0,"pile->getTopCardValue()","Value::Ace",
             (optional<solitaire::cards::Value> *)&local_e8,&local_ec);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e0);
  if (!bVar1) {
    testing::Message::Message(&local_f8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_e0);
    testing::internal::AssertHelper::AssertHelper
              (&local_100,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/piles/FoundationPileTests.cpp"
               ,0x3d,pcVar3);
    testing::internal::AssertHelper::operator=(&local_100,&local_f8);
    testing::internal::AssertHelper::~AssertHelper(&local_100);
    testing::Message::~Message(&local_f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e0);
  std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>::~vector
            ((vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> *)local_28);
  return;
}

Assistant:

TEST_F(EmptyFoundationPileTest, tryAddAce) {
    const Cards pileCards {
        Card {Value::Ace, Suit::Heart}
    };

    std::optional<Card> cardToAdd = pileCards.front();

    pile->tryAddCard(cardToAdd);

    EXPECT_EQ(cardToAdd, std::nullopt);
    EXPECT_THAT(pile->getCards(), ContainerEq(pileCards));
    EXPECT_EQ(pile->getTopCardValue(), Value::Ace);
}